

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutLutBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  float fVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar6;
  
  uVar5 = *(uint *)&pCut->field_0x1c;
  iVar3 = 0;
  if (0xffffff < uVar5) {
    if ((uVar5 & 0xff000000) == 0x1000000) {
      *pPerm = '\0';
      if (*(uint *)&pCut->field_0x1c < 0x1000000) {
        __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
      }
      fVar1 = pCut[1].Area;
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
LAB_0041dd4e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
    }
    else {
      if (pCut->iCutFunc < 0) {
LAB_0041dd6d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar5 = uVar5 >> 0x18;
      uVar6 = (ulong)uVar5;
      uVar7 = 6;
      if (6 < uVar5) {
        uVar7 = uVar5;
      }
      uVar7 = uVar7 * ((uint)pCut->iCutFunc >> 1);
      if (p->vTtPerms[uVar6]->nSize <= (int)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
      }
      iVar3 = *p->pPars->pLutStruct + -0x30;
      if (pCut->uMaskFunc < 1 == iVar3 < (int)uVar5) {
        __assert_fail("(If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0x155,"int If_CutLutBalancePinDelays(If_Man_t *, If_Cut_t *, char *)");
      }
      pcVar2 = p->vTtPerms[uVar6]->pArray;
      uVar5 = 0;
      uVar9 = 0;
      do {
        if ((iVar3 < (int)uVar6) && (((uint)pCut->uMaskFunc >> (uVar5 & 0x1f) & 1) != 0)) {
          bVar10 = pcVar2[uVar9 + uVar7];
          cVar4 = '\x02';
        }
        else {
          bVar10 = pcVar2[uVar9 + uVar7];
          cVar4 = '\x01';
        }
        if ((char)bVar10 < '\0') goto LAB_0041dd6d;
        pPerm[bVar10 >> 1] = cVar4;
        uVar9 = uVar9 + 1;
        uVar6 = (ulong)(*(uint *)&pCut->field_0x1c >> 0x18);
        uVar5 = uVar5 + 2;
      } while (uVar9 < uVar6);
      iVar3 = -1;
      if (0xffffff < *(uint *)&pCut->field_0x1c) {
        uVar9 = 0;
        do {
          fVar1 = (&pCut[1].Area)[uVar9];
          if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) goto LAB_0041dd4e;
          iVar8 = (int)pPerm[uVar9] + (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
          if (iVar3 <= iVar8) {
            iVar3 = iVar8;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
    }
  }
  return iVar3;
}

Assistant:

int If_CutLutBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, Delay, DelayMax = -1;
        assert( (If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0) );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            if ( If_CutLeaveNum(pCut) > LutSize && ((pCut->uMaskFunc >> (i << 1)) & 1) )
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 2;
            else
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 1;
        }
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            Delay = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
            DelayMax = Abc_MaxInt( DelayMax, Delay + (int)pPerm[i] );
        }
        return DelayMax;
    }
}